

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

VarSlice * __thiscall kratos::Var::operator[](Var *this,pair<unsigned_int,_unsigned_int> slice)

{
  type_conflict2 tVar1;
  initializer_list<const_kratos::IRNode_*> __l;
  initializer_list<const_kratos::IRNode_*> __l_00;
  initializer_list<const_kratos::IRNode_*> __l_01;
  type *ptVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint32_t uVar8;
  VarException *pVVar9;
  size_type sVar10;
  reference pvVar11;
  element_type *peVar12;
  undefined4 extraout_var;
  uint32_t *puVar13;
  undefined4 extraout_var_00;
  element_type *peVar14;
  remove_reference_t<unsigned_int_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_448;
  __shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2> local_390;
  element_type *local_380;
  undefined4 local_378;
  int local_374;
  element_type *local_370;
  undefined1 local_368 [8];
  shared_ptr<kratos::PackedSlice> packed_slice;
  PackedInterface *s_1;
  undefined1 local_348 [8];
  shared_ptr<kratos::VarSlice> var_slice;
  shared_ptr<kratos::VarSlice> *s;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
  *__range1;
  Var *local_310;
  Var **local_308;
  size_type local_300;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2f8;
  string local_2e0;
  undefined1 local_2ba;
  allocator<const_kratos::IRNode_*> local_2b9;
  Var *local_2b8;
  Var **local_2b0;
  size_type local_2a8;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_2a0;
  undefined1 local_284 [42];
  undefined1 local_25a;
  allocator<const_kratos::IRNode_*> local_259;
  Var *local_258;
  Var **local_250;
  size_type local_248;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_240;
  string local_218;
  char (*local_1f8) [38];
  type *low;
  type *high;
  Var *local_1e0;
  Var *this_local;
  pair<unsigned_int,_unsigned_int> slice_local;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_1c8;
  basic_string_view<char> local_1b8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  local_1a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  *local_180;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  *vargs;
  char (*local_170) [38];
  char *local_168;
  string *local_160;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_158;
  basic_string_view<char> local_148;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  local_138;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_110;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *vargs_1;
  type *local_100;
  char *local_f8;
  undefined1 *local_f0;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  local_e8;
  basic_string_view<char> local_d8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  local_c8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_a8;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *vargs_2;
  type *local_98;
  char *local_90;
  string *local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  *local_80;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  *local_70;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_68;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
  *local_60;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_58;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_48;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_40;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_30;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
  *local_10;
  
  high = (type *)slice;
  local_1e0 = this;
  this_local = (Var *)slice;
  low = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)&high);
  local_1f8 = (char (*) [38])
              std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)&high);
  if (*low < *(uint *)*local_1f8) {
    local_25a = 1;
    pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
    local_160 = &local_218;
    local_168 = "low ({0}) cannot be larger than ({1})";
    local_170 = local_1f8;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_const_unsigned_int>
             *)low;
    fmt::v7::make_args_checked<unsigned_int_const&,unsigned_int_const&,char[38],char>
              (&local_1a8,(v7 *)"low ({0}) cannot be larger than ({1})",local_1f8,low,in_R8);
    local_180 = &local_1a8;
    local_1b8 = fmt::v7::to_string_view<char,_0>(local_168);
    local_78 = &local_1c8;
    local_80 = local_180;
    local_70 = local_180;
    local_60 = local_180;
    local_68 = local_78;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_78,0x22,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_180);
    format_str.size_ = local_1c8.desc_;
    format_str.data_ = (char *)local_1b8.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_1c8.field_1.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_218,(detail *)local_1b8.data_,format_str,args);
    local_250 = &local_258;
    local_248 = 1;
    local_258 = this;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_259);
    __l_01._M_len = local_248;
    __l_01._M_array = (iterator)local_250;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_240,__l_01,&local_259);
    VarException::VarException(pVVar9,&local_218,&local_240);
    local_25a = 0;
    __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
  }
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->size_);
  if ((sVar10 == 1) &&
     (pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(&this->size_),
     *pvVar11 == 1)) {
    uVar6 = *low;
    uVar5 = (*(this->super_IRNode)._vptr_IRNode[7])();
    if (uVar5 <= uVar6) {
      local_2ba = 1;
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      ptVar2 = low;
      local_284._0_4_ = (*(this->super_IRNode)._vptr_IRNode[7])();
      local_f0 = local_284 + 4;
      local_f8 = "high ({0}) has to be smaller than width ({1})";
      local_100 = ptVar2;
      vargs_1 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
                 *)local_284;
      fmt::v7::make_args_checked<unsigned_int_const&,unsigned_int,char[46],char>
                (&local_138,(v7 *)"high ({0}) has to be smaller than width ({1})",
                 (char (*) [46])ptVar2,(remove_reference_t<const_unsigned_int_&> *)vargs_1,in_R8);
      local_110 = &local_138;
      local_148 = fmt::v7::to_string_view<char,_0>(local_f8);
      local_40 = &local_158;
      local_48 = local_110;
      local_38 = local_110;
      local_28 = local_110;
      local_30 = local_40;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_40,0x22,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_110);
      format_str_00.size_ = local_158.desc_;
      format_str_00.data_ = (char *)local_148.size_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_00.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_158.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)(local_284 + 4),(detail *)local_148.data_,format_str_00,args_00);
      local_2b0 = &local_2b8;
      local_2a8 = 1;
      local_2b8 = this;
      std::allocator<const_kratos::IRNode_*>::allocator(&local_2b9);
      __l_00._M_len = local_2a8;
      __l_00._M_array = (iterator)local_2b0;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_2a0,__l_00,&local_2b9);
      VarException::VarException(pVVar9,(string *)(local_284 + 4),&local_2a0);
      local_2ba = 0;
      __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
    }
  }
  else {
    uVar6 = *low;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(&this->size_);
    if (*pvVar11 <= uVar6) {
      __range1._6_1_ = 1;
      pVVar9 = (VarException *)__cxa_allocate_exception(0x10);
      ptVar2 = low;
      vargs_2 = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_unsigned_int,_unsigned_int>
                 *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front(&this->size_);
      local_88 = &local_2e0;
      local_90 = "high ({0}) has to be smaller than size ({1})";
      local_98 = ptVar2;
      fmt::v7::make_args_checked<unsigned_int_const&,unsigned_int&,char[45],char>
                (&local_c8,(v7 *)"high ({0}) has to be smaller than size ({1})",
                 (char (*) [45])ptVar2,(remove_reference_t<const_unsigned_int_&> *)vargs_2,in_R8);
      local_a8 = &local_c8;
      local_d8 = fmt::v7::to_string_view<char,_0>(local_90);
      local_50 = &local_e8;
      local_58 = local_a8;
      local_20 = local_a8;
      local_10 = local_a8;
      local_18 = local_50;
      fmt::v7::
      basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      ::basic_format_args(local_50,0x22,
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)local_a8);
      format_str_01.size_ = local_e8.desc_;
      format_str_01.data_ = (char *)local_d8.size_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)local_e8.field_1.values_;
      fmt::v7::detail::vformat_abi_cxx11_(&local_2e0,(detail *)local_d8.data_,format_str_01,args_01)
      ;
      local_308 = &local_310;
      local_300 = 1;
      local_310 = this;
      std::allocator<const_kratos::IRNode_*>::allocator
                ((allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      __l._M_len = local_300;
      __l._M_array = (iterator)local_308;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_2f8,__l,(allocator<const_kratos::IRNode_*> *)((long)&__range1 + 7));
      VarException::VarException(pVVar9,&local_2e0,&local_2f8);
      __range1._6_1_ = 0;
      __cxa_throw(pVVar9,&VarException::typeinfo,VarException::~VarException);
    }
  }
  __end1 = std::
           vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
           ::begin(&this->slices_);
  s = (shared_ptr<kratos::VarSlice> *)
      std::
      vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>
      ::end(&this->slices_);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
                                     *)&s), bVar3) {
    var_slice.super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
         ::operator*(&__end1);
    peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)var_slice.
                            super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi);
    uVar6 = (*(peVar12->super_Var).super_IRNode._vptr_IRNode[0x2b])();
    if ((((uVar6 & 1) == 0) &&
        (uVar8 = *low,
        peVar12 = std::
                  __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)var_slice.
                                super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi), uVar8 == peVar12->high)) &&
       (tVar1 = *(type_conflict2 *)*local_1f8,
       peVar12 = std::
                 __shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)var_slice.
                               super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi), tVar1 == peVar12->low)) {
      peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)var_slice.
                               super___shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
      return peVar12;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::VarSlice>_*,_std::vector<std::shared_ptr<kratos::VarSlice>,_std::allocator<std::shared_ptr<kratos::VarSlice>_>_>_>
    ::operator++(&__end1);
  }
  s_1 = (PackedInterface *)this;
  std::make_shared<kratos::VarSlice,kratos::Var*,unsigned_int_const&,unsigned_int_const&>
            ((Var **)local_348,(uint *)&s_1,low);
  if (this->width_param_ != (Var *)0x0) {
    peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_348);
    (*(peVar12->super_Var).super_IRNode._vptr_IRNode[0x23])(peVar12,this->width_param_);
  }
  iVar7 = (*(this->super_IRNode)._vptr_IRNode[0x29])();
  bVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar7) + 0xb8))();
  if ((bVar4 & 1) != 0) {
    peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_348);
    uVar8 = (*(peVar12->super_Var).super_IRNode._vptr_IRNode[7])();
    peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_348);
    puVar13 = var_width(&peVar12->super_Var);
    if (uVar8 == *puVar13) {
      iVar7 = (*(this->super_IRNode)._vptr_IRNode[0x29])();
      if (CONCAT44(extraout_var_00,iVar7) == 0) {
        local_448 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_448 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    __dynamic_cast(CONCAT44(extraout_var_00,iVar7),&typeinfo,
                                   &PackedInterface::typeinfo,0xfffffffffffffffe);
      }
      packed_slice.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_448;
      local_370 = std::__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2>::get
                            ((__shared_ptr<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2> *)local_348
                            );
      peVar12 = std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_348);
      local_374 = (*(peVar12->super_Var).super_IRNode._vptr_IRNode[7])();
      local_374 = local_374 + -1;
      local_378 = 0;
      (*(packed_slice.super___shared_ptr<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[2])(&local_390);
      local_380 = std::__shared_ptr<kratos::PackedStruct,_(__gnu_cxx::_Lock_policy)2>::get
                            (&local_390);
      std::make_shared<kratos::PackedSlice,kratos::VarSlice*,unsigned_int,int,kratos::PackedStruct*>
                ((VarSlice **)local_368,(uint *)&local_370,&local_374,(PackedStruct **)&local_378);
      std::shared_ptr<kratos::PackedStruct>::~shared_ptr
                ((shared_ptr<kratos::PackedStruct> *)&local_390);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::PackedSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)&this->slices_,(shared_ptr<kratos::PackedSlice> *)local_368);
      peVar14 = std::
                __shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<kratos::PackedSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_368);
      std::
      vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
      emplace_back<std::shared_ptr<kratos::VarSlice>&>
                ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
                  *)&(peVar14->super_VarSlice).super_Var.slices_,
                 (shared_ptr<kratos::VarSlice> *)local_348);
      std::shared_ptr<kratos::VarSlice>::operator=
                ((shared_ptr<kratos::VarSlice> *)local_348,
                 (shared_ptr<kratos::PackedSlice> *)local_368);
      std::shared_ptr<kratos::PackedSlice>::~shared_ptr
                ((shared_ptr<kratos::PackedSlice> *)local_368);
      goto LAB_00909c04;
    }
  }
  std::vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>::
  emplace_back<std::shared_ptr<kratos::VarSlice>&>
            ((vector<std::shared_ptr<kratos::VarSlice>,std::allocator<std::shared_ptr<kratos::VarSlice>>>
              *)&this->slices_,(shared_ptr<kratos::VarSlice> *)local_348);
LAB_00909c04:
  slice_local = (pair<unsigned_int,_unsigned_int>)
                std::__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<kratos::VarSlice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_348);
  std::shared_ptr<kratos::VarSlice>::~shared_ptr((shared_ptr<kratos::VarSlice> *)local_348);
  return (VarSlice *)slice_local;
}

Assistant:

VarSlice &Var::operator[](std::pair<uint32_t, uint32_t> slice) {
    auto const [high, low] = slice;
    if (low > high) {
        throw VarException(::format("low ({0}) cannot be larger than ({1})", low, high), {this});
    }
    // if the size is not 1, we are slicing off size, not width
    if (size_.size() == 1 && size_.front() == 1) {
        if (high >= width()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than width ({1})", high, width()), {this});
        }
    } else {
        if (high >= size_.front()) {
            throw VarException(
                ::format("high ({0}) has to be smaller than size ({1})", high, size_.front()),
                {this});
        }
    }
    // if there is one already
    for (auto const &s : slices_) {
        if (!s->sliced_by_var()) {
            if (high == s->high && low == s->low) return *s;
        }
    }
    // create a new one
    // notice that slice is not part of generator's variables. It's handled by the parent (var)
    // itself
    std::shared_ptr<VarSlice> var_slice = ::make_shared<VarSlice>(this, high, low);
    if (width_param_) {
        var_slice->set_width_param(width_param_);
    }
    // depends on the root variable, if it is actually a struct, we need to return to the
    // actual trampoline class as proxy
    if (get_var_root_parent()->is_struct() && var_slice->width() == var_slice->var_width()) {
        // we actually reached the real struct
        auto *s = dynamic_cast<PackedInterface *>(get_var_root_parent());
        auto packed_slice = std::make_shared<PackedSlice>(var_slice.get(), var_slice->width() - 1,
                                                          0, s->packed_struct().get());
        slices_.emplace_back(packed_slice);
        // this is a hack here, but we store the parent into the child
        packed_slice->slices_.emplace_back(var_slice);
        var_slice = packed_slice;
    } else {
        slices_.emplace_back(var_slice);
    }

    return *var_slice;
}